

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# string_convert.h
# Opt level: O2

string * __thiscall
Potassco::toString<Clasp::SolverStrategies::LbdMode,unsigned_int>
          (string *__return_storage_ptr__,Potassco *this,LbdMode *x,uint *y)

{
  ulong uVar1;
  string *psVar2;
  string res;
  Span<Potassco::KV> local_20;
  
  res._M_dataplus._M_p = (pointer)&res.field_2;
  res._M_string_length = 0;
  res.field_2._M_local_buf[0] = '\0';
  local_20.first = (KV *)Clasp::enumMap(Clasp::SolverStrategies::LbdMode_const*)::map;
  local_20.size = 3;
  findKey(&local_20,*(int *)this);
  uVar1 = std::__cxx11::string::append((char *)&res);
  std::__cxx11::string::append(uVar1,'\x01');
  psVar2 = xconvert(&res,*x);
  std::__cxx11::string::string((string *)__return_storage_ptr__,(string *)psVar2);
  std::__cxx11::string::~string((string *)&res);
  return __return_storage_ptr__;
}

Assistant:

inline std::string toString(const T& x, const U& y) {
	std::string res;
	xconvert(res, x).append(1, ',');
	return xconvert(res, y);
}